

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

string * __thiscall
kratos::SystemVerilogCodeGen::get_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Var *var)

{
  size_type *s;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view format_str;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_58;
  undefined8 uStack_50;
  size_type *local_40;
  string format;
  
  local_40 = &format._M_string_length;
  format._M_dataplus._M_p = (pointer)0x0;
  format._M_string_length._0_1_ = 0;
  std::__cxx11::string::assign((char *)&local_40);
  s = local_40;
  (*this->_vptr_SystemVerilogCodeGen[0x1f])(&local_78,this);
  local_58 = local_78;
  uStack_50 = uStack_70;
  bVar1 = fmt::v7::to_string_view<char,_0>((char *)s);
  format_str.data_ = (char *)bVar1.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  format_str.size_ = 0xd;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar1.data_,format_str,args);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_width_str(Var* var) {
    std::string format;
    if (var->type() == VarType::Parameter)
        format = "[{0}-1:0]";
    else
        format = "[({0})-1:0]";
    return ::format(format.c_str(), var->to_string());
}